

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CADFile.cpp
# Opt level: O0

void __thiscall CADFile::CADFile(CADFile *this,vector<char,_std::allocator<char>_> *buf)

{
  BRDPartMountingSide BVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  void *pvVar6;
  BRDPoint *pBVar7;
  mapped_type *pmVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  reference pvVar9;
  BRDPart *__s_00;
  char *pcVar10;
  size_t sVar11;
  size_type sVar12;
  vector<char,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  double posy_1;
  double posx_1;
  BRDNail nail;
  char *netr_1;
  char *netr;
  double posy;
  double posx;
  char *ptr;
  char *part_1;
  BRDPin pin_1;
  char *loc;
  BRDPin pin;
  BRDPart part;
  char *s;
  char *p;
  char *line;
  iterator __end1;
  iterator __begin1;
  vector<char_*,_std::allocator<char_*>_> *__range1;
  vector<char_*,_std::allocator<char_*>_> lines;
  char *nailnet;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  parts_id;
  Block current_block;
  char *arena_end;
  char *arena;
  size_t file_buf_size;
  char *saved_locale;
  float multiplier;
  size_type buffer_size;
  key_type *in_stack_fffffffffffff848;
  BRDPin *in_stack_fffffffffffff850;
  value_type *in_stack_fffffffffffff858;
  BRDPart *in_stack_fffffffffffff860;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffff868;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffff870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff890;
  undefined8 in_stack_fffffffffffff898;
  char **__endptr;
  BRDFileBase *in_stack_fffffffffffff8a0;
  CADFile *in_stack_fffffffffffff920;
  allocator<char> local_5b9;
  string local_5b8 [32];
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  long *local_580;
  undefined1 **local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  long *local_558;
  undefined1 **local_550;
  int local_548;
  int local_544;
  mapped_type local_53c;
  undefined4 local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_530;
  allocator<char> local_509;
  string local_508 [32];
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  long *local_4d8;
  undefined1 **local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  long *local_4b8;
  undefined1 **local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  long *local_490;
  undefined1 **local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  long *local_470;
  undefined1 **local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  long *local_450;
  undefined1 **local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  long *local_430;
  undefined1 **local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  long *local_410;
  undefined1 **local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  long *local_3f0;
  undefined1 **local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  long *local_3d0;
  undefined1 **local_3c8;
  char *local_388;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined1 local_340 [8];
  undefined1 local_338 [16];
  char **local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_320;
  undefined1 local_310 [24];
  BRDPart *local_2f8;
  int local_2b4;
  undefined1 *local_2b0;
  long local_2a8;
  char *local_2a0;
  char *local_298;
  string local_290 [39];
  allocator<char> local_269;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  size_t local_168;
  string local_160 [55];
  allocator<char> local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  char *local_28;
  float local_1c;
  ulong local_18;
  vector<char,_std::allocator<char>_> *local_10;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffff898 >> 0x20);
  local_10 = in_RSI;
  BRDFileBase::BRDFileBase(in_stack_fffffffffffff8a0);
  *in_RDI = &PTR__CADFile_00302fa0;
  local_18 = std::vector<char,_std::allocator<char>_>::size(local_10);
  local_1c = 1000.0;
  local_28 = setlocale(1,"C");
  if (local_18 < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
               (allocator<char> *)in_stack_fffffffffffff880);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
    std::__cxx11::to_string(iVar4);
    std::operator+(in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    uVar5 = std::__cxx11::string::c_str();
    SDL_LogError(1,"%s",uVar5);
  }
  else {
    local_168 = (local_18 + 1) * 3;
    pvVar6 = calloc(1,local_168);
    in_RDI[0x17] = pvVar6;
    if (in_RDI[0x17] == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                 (allocator<char> *)in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
      std::__cxx11::to_string(iVar4);
      std::operator+(in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_188);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_290);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator(&local_269);
      uVar5 = std::__cxx11::string::c_str();
      SDL_LogError(1,"%s",uVar5);
    }
    else {
      local_298 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_fffffffffffff848);
      local_2a0 = (char *)std::vector<char,_std::allocator<char>_>::end
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_fffffffffffff848);
      std::copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char*>
                (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                 (char *)in_stack_fffffffffffff860);
      *(undefined1 *)(in_RDI[0x17] + local_18) = 0;
      local_2a8 = local_18 + 1 + in_RDI[0x17];
      local_2b0 = (undefined1 *)(in_RDI[0x17] + -1 + local_168);
      *local_2b0 = 0;
      local_2b4 = 1;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)0x178e2a);
      std::vector<char_*,_std::allocator<char_*>_>::vector
                ((vector<char_*,_std::allocator<char_*>_> *)0x178e3f);
      stringfile(in_stack_fffffffffffff870._M_current,
                 (vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffff868._M_current);
      local_320._8_8_ = local_310;
      local_320._M_allocated_capacity =
           (size_type)
           std::vector<char_*,_std::allocator<char_*>_>::begin
                     ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffff848);
      local_328 = (char **)std::vector<char_*,_std::allocator<char_*>_>::end
                                     ((vector<char_*,_std::allocator<char_*>_> *)
                                      in_stack_fffffffffffff848);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                 *)in_stack_fffffffffffff850,
                                (__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                 *)in_stack_fffffffffffff848), bVar3) {
        pBVar7 = (BRDPoint *)
                 __gnu_cxx::
                 __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
                 operator*((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                            *)&local_320._M_allocated_capacity);
        local_338._8_8_ = *pBVar7;
        while (iVar4 = isspace((uint)*(byte *)local_338._8_8_), iVar4 != 0) {
          local_338._8_8_ = local_338._8_8_ + 1;
        }
        __s_00 = local_2f8;
        if (*(byte *)local_338._8_8_ != 0) {
          iVar4 = strncmp((char *)local_338._8_8_,"COMP",4);
          if (iVar4 == 0) {
            local_2b4 = 2;
          }
          else {
            iVar4 = strncmp((char *)local_338._8_8_,"C_PIN",5);
            if (iVar4 == 0) {
              local_2b4 = 3;
            }
            else {
              iVar4 = strncmp((char *)local_338._8_8_,"NET ",4);
              if (iVar4 == 0) {
                local_2b4 = 4;
              }
              else {
                iVar4 = strncmp((char *)local_338._8_8_,"N_VIA",5);
                if (iVar4 != 0) {
                  local_2b4 = 0;
                  __s_00 = local_2f8;
                  goto switchD_0017902b_default;
                }
                local_2b4 = 5;
              }
            }
          }
          local_338._0_8_ = local_338._8_8_;
          __s_00 = local_2f8;
          switch(local_2b4) {
          case 2:
            BRDPart::BRDPart(in_stack_fffffffffffff860);
            BRDPin::BRDPin(in_stack_fffffffffffff850);
            local_3e0 = local_338;
            local_3d8 = local_340;
            local_3d0 = &local_2a8;
            local_3c8 = &local_2b0;
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_400 = local_338;
            local_3f8 = local_340;
            local_3f0 = &local_2a8;
            local_3e8 = &local_2b0;
            local_388 = CADFile::anon_class_32_4_fa413470::operator()
                                  ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_420 = local_338;
            local_418 = local_340;
            local_410 = &local_2a8;
            local_408 = &local_2b0;
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_440 = local_338;
            local_438 = local_340;
            local_430 = &local_2a8;
            local_428 = &local_2b0;
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_460 = local_338;
            local_458 = local_340;
            local_450 = &local_2a8;
            local_448 = &local_2b0;
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_480 = local_338;
            local_478 = local_340;
            local_470 = &local_2a8;
            local_468 = &local_2b0;
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_4a0 = local_338;
            local_498 = local_340;
            local_490 = &local_2a8;
            local_488 = &local_2b0;
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_4c8 = local_338;
            local_4c0 = local_340;
            local_4b8 = &local_2a8;
            local_4b0 = &local_2b0;
            local_4a8 = CADFile::anon_class_32_4_fa413470::operator()
                                  ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_4e8 = local_338;
            local_4e0 = local_340;
            local_4d8 = &local_2a8;
            local_4d0 = &local_2b0;
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_35c = 0;
            iVar4 = strcmp(local_4a8,"1");
            if (iVar4 == 0) {
              local_360 = 2;
            }
            else {
              local_360 = 1;
            }
            local_358 = 0;
            std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                      ((vector<BRDPart,_std::allocator<BRDPart>_> *)in_stack_fffffffffffff860,
                       in_stack_fffffffffffff858);
            sVar12 = std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                               ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                       (allocator<char> *)in_stack_fffffffffffff880);
            pmVar8 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
            *pmVar8 = (mapped_type)sVar12;
            std::__cxx11::string::~string(local_508);
            std::allocator<char>::~allocator(&local_509);
            BRDPart::~BRDPart((BRDPart *)0x179468);
            __s_00 = local_2f8;
            break;
          case 3:
            BRDPin::BRDPin(in_stack_fffffffffffff850);
            local_568 = local_338;
            local_560 = local_340;
            local_558 = &local_2a8;
            local_550 = &local_2b0;
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_590 = local_338;
            local_588 = local_340;
            local_580 = &local_2a8;
            local_578 = &local_2b0;
            local_570 = CADFile::anon_class_32_4_fa413470::operator()
                                  ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            local_598 = strchr(local_570,0x2d);
            if (local_598 != (char *)0x0) {
              *local_598 = '\0';
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                       (allocator<char> *)in_stack_fffffffffffff880);
            pmVar8 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
            local_53c = *pmVar8;
            std::__cxx11::string::~string(local_5b8);
            std::allocator<char>::~allocator(&local_5b9);
            __endptr = (char **)local_338;
            dVar2 = strtod((char *)local_338._0_8_,__endptr);
            local_548 = (int)(dVar2 * (double)local_1c);
            dVar2 = strtod((char *)local_338._0_8_,__endptr);
            local_544 = (int)(dVar2 * (double)local_1c);
            strtod((char *)local_338._0_8_,__endptr);
            strtod((char *)local_338._0_8_,__endptr);
            strtod((char *)local_338._0_8_,__endptr);
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CADFile::anon_class_32_4_fa413470::operator()
                            ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            in_stack_fffffffffffff890 = __s;
            pcVar10 = strchr((char *)__s,0x2f);
            if (pcVar10 != (char *)0x0) {
              in_stack_fffffffffffff888 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &__s->field_0x1;
              in_stack_fffffffffffff880 = __s;
              sVar11 = strlen((char *)__s);
              memmove(in_stack_fffffffffffff880,in_stack_fffffffffffff888,sVar11);
            }
            local_530 = __s;
            pvVar9 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                               ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                                (ulong)(local_53c - 1));
            BVar1 = pvVar9->mounting_side;
            if (BVar1 == Both) {
              local_538 = 0;
            }
            else if (BVar1 == Bottom) {
              local_538 = 1;
            }
            else if (BVar1 == Top) {
              local_538 = 2;
            }
            std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                      ((vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffff860,
                       (value_type *)in_stack_fffffffffffff858);
            __s_00 = local_2f8;
            break;
          case 4:
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            __s_00 = (BRDPart *)
                     CADFile::anon_class_32_4_fa413470::operator()
                               ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            pcVar10 = strchr((char *)__s_00,0x2f);
            if (pcVar10 != (char *)0x0) {
              pcVar10 = (char *)((long)&__s_00->name + 1);
              in_stack_fffffffffffff860 = __s_00;
              sVar11 = strlen((char *)__s_00);
              memmove(in_stack_fffffffffffff860,pcVar10,sVar11);
            }
            break;
          case 5:
            BRDNail::BRDNail((BRDNail *)in_stack_fffffffffffff850);
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            in_stack_fffffffffffff858 = (value_type *)local_338;
            strtod((char *)local_338._0_8_,(char **)in_stack_fffffffffffff858);
            strtod((char *)local_338._0_8_,&in_stack_fffffffffffff858->name);
            CADFile::anon_class_32_4_fa413470::operator()
                      ((anon_class_32_4_fa413470 *)in_stack_fffffffffffff850);
            in_stack_fffffffffffff850 = (BRDPin *)local_338;
            strtod((char *)local_338._0_8_,(char **)in_stack_fffffffffffff850);
            strtod((char *)local_338._0_8_,(char **)in_stack_fffffffffffff850);
            std::vector<BRDNail,_std::allocator<BRDNail>_>::push_back
                      ((vector<BRDNail,_std::allocator<BRDNail>_> *)in_stack_fffffffffffff860,
                       (value_type *)in_stack_fffffffffffff858);
            __s_00 = local_2f8;
          }
        }
switchD_0017902b_default:
        local_2f8 = __s_00;
        __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
        operator++((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *)
                   &local_320._M_allocated_capacity);
      }
      gen_outline(in_stack_fffffffffffff920);
      sVar12 = std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                         ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9));
      *(int *)((long)in_RDI + 0xc) = (int)sVar12;
      sVar12 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                         ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc));
      *(int *)(in_RDI + 2) = (int)sVar12;
      sVar12 = std::vector<BRDPoint,_std::allocator<BRDPoint>_>::size
                         ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)(in_RDI + 3));
      *(int *)(in_RDI + 1) = (int)sVar12;
      sVar12 = std::vector<BRDNail,_std::allocator<BRDNail>_>::size
                         ((vector<BRDNail,_std::allocator<BRDNail>_> *)(in_RDI + 0xf));
      *(int *)((long)in_RDI + 0x14) = (int)sVar12;
      setlocale(1,local_28);
      *(bool *)(in_RDI + 0x12) = local_2b4 != 1;
      std::vector<char_*,_std::allocator<char_*>_>::~vector
                ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffff860);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)0x179c5c);
    }
  }
  return;
}

Assistant:

CADFile::CADFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	float multiplier = 1000.0f;
	char *saved_locale;
	saved_locale  = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	enum Block current_block = None;
	std::unordered_map<std::string, int> parts_id; // map between part name and part number
	char *nailnet; // Net name for VIA

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

			if (!strncmp(line, "COMP", 4)) {
				current_block = Parts;
			} else if (!strncmp(line, "C_PIN", 5)) {
				current_block = Pins;
			} else if (!strncmp(line, "NET ", 4)) {
				current_block = Nets;
			} else if (!strncmp(line, "N_VIA", 5)) {
				current_block = Vias;
			} else {
				current_block = Invalid;
				continue;
			}
		char *p = line;
		char *s;

		switch (current_block) {
			case Parts: {
				BRDPart part;
				BRDPin pin;
				/*char *TYPE    =*/READ_STR();
				part.name       = READ_STR();
				/*char *Part(NR)=*/READ_STR();
				/*char *Unknown =*/READ_STR();
				/*char *Unknown =*/READ_STR();
				/*char *X       =*/READ_STR();
				/*char *Y       =*/READ_STR();
				char *loc       = READ_STR();
				/*int *Unknown  =*/READ_STR();
				part.part_type  = BRDPartType::SMD;
				if (!strcmp(loc, "1"))//top 1 bot 2
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				part.end_of_pins       = 0;
				parts.push_back(part);
				parts_id[part.name] = parts.size();
			} break;
			case Pins: {
				BRDPin pin;
				/*char *TYPE  =*/READ_STR();
				char *part    = READ_STR();
				char *ptr;
				ptr = strchr(part, '-'); //remove all after
				if (ptr != NULL)         //
					{*ptr = '\0';}       //
				pin.part       = parts_id.at(part);
				double posx    = READ_DOUBLE();
				pin.pos.x      = posx * multiplier;
				double posy    = READ_DOUBLE();
				pin.pos.y      = posy * multiplier;
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_STR();
				char *netr     = READ_STR();
				if (strchr(netr, '/'))
					memmove(&netr[0],
					&netr[0 + 1],
					strlen(netr));
				pin.net        = netr;
				switch (parts[pin.part - 1].mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				pins.push_back(pin);
			} break;
			case Nets: {
				/*char *TYPE  =*/READ_STR();
				char *netr     = READ_STR();
				if (strchr(netr, '/'))
					memmove(&netr[0],
					&netr[0 + 1],
					strlen(netr));
				nailnet        = netr;
			} break;
			case Vias: {
				BRDNail nail;
				nail.net     = nailnet;
				/*STR *TYPE  =*/READ_STR();
				double posx  = READ_DOUBLE();
				nail.pos.x   = posx * multiplier;
				double posy  = READ_DOUBLE();
				nail.pos.y   = posy * multiplier;
				/*STR        =*/READ_STR();
				nail.side    = READ_DOUBLE() == 1 ? BRDPartMountingSide::Top : BRDPartMountingSide::Bottom;
				/*double     =*/READ_DOUBLE();
				nails.push_back(nail);
			} break;
			default: continue;
		}
	}
	gen_outline();
	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != None;
}